

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void state_TEXLD(Context *ctx)

{
  uint regnum;
  MOJOSHADER_samplerMap *pMVar1;
  RegisterList *pRVar2;
  uint uVar3;
  byte bVar4;
  char *pcVar5;
  ulong uVar6;
  
  if (ctx->major_ver < 2) {
    bVar4 = 0;
    if (ctx->minor_ver != 0xff) {
      bVar4 = ctx->minor_ver;
    }
    if (0x10003 < ((uint)bVar4 | (uint)ctx->major_ver << 0x10)) {
      return;
    }
    regnum = (ctx->dest_arg).regnum;
    if ((ctx->dest_arg).regtype != REG_TYPE_ADDRESS) {
      failf(ctx,"%s","TEX param must be a texture register");
    }
    pRVar2 = reglist_insert(ctx,&ctx->samplers,REG_TYPE_SAMPLER,regnum);
    pMVar1 = ctx->samplermap;
    uVar3 = 2;
    if ((pMVar1 != (MOJOSHADER_samplerMap *)0x0) && ((ulong)ctx->samplermap_count != 0)) {
      uVar6 = 0;
      do {
        if (pMVar1[uVar6].index == regnum) {
          uVar3 = pMVar1[uVar6].type + MOJOSHADER_SAMPLER_VOLUME;
          break;
        }
        uVar6 = uVar6 + 1;
      } while (ctx->samplermap_count != uVar6);
    }
    pRVar2->index = uVar3;
    pRVar2 = reglist_insert(ctx,&ctx->attributes,REG_TYPE_ADDRESS,regnum);
    pRVar2->usage = MOJOSHADER_USAGE_TEXCOORD;
    pRVar2->index = regnum;
    pRVar2->writemask = 0xf;
    pRVar2->misc = 0;
    return;
  }
  if (ctx->source_args[0].src_mod == SRCMOD_NONE) {
    if (ctx->source_args[1].regtype != REG_TYPE_SAMPLER) {
      pcVar5 = "TEXLD src1 must be sampler register";
      goto LAB_00115dc6;
    }
    if (ctx->source_args[1].src_mod != SRCMOD_NONE) {
      pcVar5 = "TEXLD src1 must have no modifiers";
      goto LAB_00115dc6;
    }
    if (2 < ctx->instruction_controls) {
      pcVar5 = "TEXLD has unknown control bits";
      goto LAB_00115dc6;
    }
  }
  else {
    pcVar5 = "TEXLD src0 must have no modifiers";
LAB_00115dc6:
    failf(ctx,"%s",pcVar5);
  }
  if (ctx->major_ver < 3) {
    if (ctx->source_args[0].swizzle == 0xe4) {
      if (ctx->source_args[1].swizzle == 0xe4) goto LAB_00115e19;
      pcVar5 = "TEXLD src1 must not swizzle";
    }
    else {
      pcVar5 = "TEXLD src0 must not swizzle";
    }
    failf(ctx,"%s",pcVar5);
  }
LAB_00115e19:
  if (ctx->source_args[1].regnum == 3) {
    ctx->instruction_count = ctx->instruction_count + 3;
  }
  return;
}

Assistant:

static void state_TEXLD(Context *ctx)
{
    if (shader_version_atleast(ctx, 2, 0))
    {
        const SourceArgInfo *src0 = &ctx->source_args[0];
        const SourceArgInfo *src1 = &ctx->source_args[1];

        // !!! FIXME: verify texldp restrictions:
        //http://msdn.microsoft.com/en-us/library/bb206221(VS.85).aspx
        // !!! FIXME: ...and texldb, too.
        //http://msdn.microsoft.com/en-us/library/bb206217(VS.85).aspx

        //const RegisterType rt0 = src0->regtype;

        // !!! FIXME: msdn says it has to be temp, but Microsoft's HLSL
        // !!! FIXME:  compiler is generating code that uses oC0 for a dest.
        //if (ctx->dest_arg.regtype != REG_TYPE_TEMP)
        //    fail(ctx, "TEXLD dest must be a temp register");

        // !!! FIXME: this can be an REG_TYPE_INPUT, DCL'd to TEXCOORD.
        //else if ((rt0 != REG_TYPE_TEXTURE) && (rt0 != REG_TYPE_TEMP))
        //    fail(ctx, "TEXLD src0 must be texture or temp register");
        //else

        if (src0->src_mod != SRCMOD_NONE)
            fail(ctx, "TEXLD src0 must have no modifiers");
        else if (src1->regtype != REG_TYPE_SAMPLER)
            fail(ctx, "TEXLD src1 must be sampler register");
        else if (src1->src_mod != SRCMOD_NONE)
            fail(ctx, "TEXLD src1 must have no modifiers");
        else if ( (ctx->instruction_controls != CONTROL_TEXLD) &&
                  (ctx->instruction_controls != CONTROL_TEXLDP) &&
                  (ctx->instruction_controls != CONTROL_TEXLDB) )
        {
            fail(ctx, "TEXLD has unknown control bits");
        } // else if

        // Shader Model 3 added swizzle support to this opcode.
        if (!shader_version_atleast(ctx, 3, 0))
        {
            if (!no_swizzle(src0->swizzle))
                fail(ctx, "TEXLD src0 must not swizzle");
            else if (!no_swizzle(src1->swizzle))
                fail(ctx, "TEXLD src1 must not swizzle");
        } // if

        if ( ((TextureType) ctx->source_args[1].regnum) == TEXTURE_TYPE_CUBE )
            ctx->instruction_count += 3;
    } // if

    else if (shader_version_atleast(ctx, 1, 4))
    {
        // !!! FIXME: checks for ps_1_4 version here...
    } // else if

    else
    {
        // !!! FIXME: add (other?) checks for ps_1_1 version here...
        const DestArgInfo *info = &ctx->dest_arg;
        const int sampler = info->regnum;
        if (info->regtype != REG_TYPE_TEXTURE)
            fail(ctx, "TEX param must be a texture register");
        add_sampler(ctx, sampler, TEXTURE_TYPE_2D, 0);
        add_attribute_register(ctx, REG_TYPE_TEXTURE, sampler,
                               MOJOSHADER_USAGE_TEXCOORD, sampler, 0xF, 0);
    } // else
}